

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

U32 ZSTD_insertAndFindFirstIndex_internal
              (ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,U32 mls)

{
  undefined4 uVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  size_t h;
  U32 idx;
  U32 target;
  BYTE *base;
  U32 chainMask;
  U32 *chainTable;
  U32 hashLog;
  U32 *hashTable;
  undefined8 in_stack_ffffffffffffffa0;
  long lVar5;
  void *in_stack_ffffffffffffffa8;
  undefined4 local_50;
  
  lVar5 = *(long *)(in_RDI + 0x30);
  lVar2 = *(long *)(in_RDI + 0x40);
  uVar1 = *(undefined4 *)(in_RSI + 4);
  uVar3 = in_EDX - (int)*(undefined8 *)(in_RDI + 8);
  for (local_50 = *(uint *)(in_RDI + 0x24); local_50 < uVar3; local_50 = local_50 + 1) {
    in_stack_ffffffffffffffa8 =
         (void *)ZSTD_hashPtr(in_stack_ffffffffffffffa8,
                              (U32)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                              (U32)in_stack_ffffffffffffffa0);
    *(undefined4 *)(lVar2 + (ulong)(local_50 & (1 << ((byte)uVar1 & 0x1f)) - 1U) * 4) =
         *(undefined4 *)(lVar5 + (long)in_stack_ffffffffffffffa8 * 4);
    *(uint *)(lVar5 + (long)in_stack_ffffffffffffffa8 * 4) = local_50;
  }
  *(uint *)(in_RDI + 0x24) = uVar3;
  sVar4 = ZSTD_hashPtr(in_stack_ffffffffffffffa8,(U32)((ulong)lVar5 >> 0x20),(U32)lVar5);
  return *(U32 *)(lVar5 + sVar4 * 4);
}

Assistant:

static U32 ZSTD_insertAndFindFirstIndex_internal(
                        ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                        const BYTE* ip, U32 const mls)
{
    U32* const hashTable  = ms->hashTable;
    const U32 hashLog = cParams->hashLog;
    U32* const chainTable = ms->chainTable;
    const U32 chainMask = (1 << cParams->chainLog) - 1;
    const BYTE* const base = ms->window.base;
    const U32 target = (U32)(ip - base);
    U32 idx = ms->nextToUpdate;

    while(idx < target) { /* catch up */
        size_t const h = ZSTD_hashPtr(base+idx, hashLog, mls);
        NEXT_IN_CHAIN(idx, chainMask) = hashTable[h];
        hashTable[h] = idx;
        idx++;
    }

    ms->nextToUpdate = target;
    return hashTable[ZSTD_hashPtr(ip, hashLog, mls)];
}